

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_writeFrameHeader
                 (void *dst,size_t dstCapacity,ZSTD_CCtx_params params,U64 pledgedSrcSize,U32 dictID
                 )

{
  void *pvVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  bool local_6d;
  void *local_60;
  size_t pos;
  BYTE frameHeaderDecriptionByte;
  U32 fcsCode;
  BYTE windowLogByte;
  U32 singleSegment;
  U32 windowSize;
  U32 checksumFlag;
  U32 dictIDSizeCode;
  U32 dictIDSizeCodeLength;
  BYTE *op;
  U32 dictID_local;
  U64 pledgedSrcSize_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  cVar3 = (dictID != 0) + (0xff < dictID) + (0xffff < dictID);
  if (params.fParams.noDictIDFlag != 0) {
    cVar3 = '\0';
  }
  bVar4 = pledgedSrcSize <= (uint)(1 << ((byte)params.cParams.windowLog & 0x1f));
  local_6d = params.fParams.contentSizeFlag != 0 && bVar4;
  if (params.fParams.contentSizeFlag == 0) {
    cVar2 = '\0';
  }
  else {
    cVar2 = (0xff < pledgedSrcSize) + (0x100ff < pledgedSrcSize) + (0xfffffffe < pledgedSrcSize);
  }
  local_60 = (void *)0x0;
  if (dstCapacity < 0x12) {
    dst_local = (void *)0xffffffffffffffba;
  }
  else {
    if (params.format == ZSTD_f_zstd1) {
      MEM_writeLE32(dst,0xfd2fb528);
      local_60 = (void *)0x4;
    }
    *(char *)((long)dst + (long)local_60) =
         cVar3 + (0 < params.fParams.checksumFlag) * '\x04' + local_6d * ' ' + cVar2 * '@';
    pvVar1 = (void *)((long)local_60 + 1);
    if (params.fParams.contentSizeFlag == 0 || !bVar4) {
      *(byte *)((long)dst + (long)local_60 + 1) = ((byte)params.cParams.windowLog - 10) * '\b';
      pvVar1 = (void *)((long)local_60 + 2);
    }
    local_60 = pvVar1;
    switch(cVar3) {
    default:
      break;
    case '\x01':
      *(char *)((long)dst + (long)local_60) = (char)dictID;
      local_60 = (void *)((long)local_60 + 1);
      break;
    case '\x02':
      MEM_writeLE16((void *)((long)dst + (long)local_60),(U16)dictID);
      local_60 = (void *)((long)local_60 + 2);
      break;
    case '\x03':
      MEM_writeLE32((void *)((long)dst + (long)local_60),dictID);
      local_60 = (void *)((long)local_60 + 4);
    }
    switch(cVar2) {
    default:
      if (local_6d) {
        *(char *)((long)dst + (long)local_60) = (char)pledgedSrcSize;
        local_60 = (void *)((long)local_60 + 1);
      }
      break;
    case '\x01':
      MEM_writeLE16((void *)((long)dst + (long)local_60),(short)pledgedSrcSize - 0x100);
      local_60 = (void *)((long)local_60 + 2);
      break;
    case '\x02':
      MEM_writeLE32((void *)((long)dst + (long)local_60),(U32)pledgedSrcSize);
      local_60 = (void *)((long)local_60 + 4);
      break;
    case '\x03':
      MEM_writeLE64((void *)((long)dst + (long)local_60),pledgedSrcSize);
      local_60 = (void *)((long)local_60 + 8);
    }
    dst_local = local_60;
  }
  return (size_t)dst_local;
}

Assistant:

static size_t ZSTD_writeFrameHeader(void* dst, size_t dstCapacity,
                                    ZSTD_CCtx_params params, U64 pledgedSrcSize, U32 dictID)
{   BYTE* const op = (BYTE*)dst;
    U32   const dictIDSizeCodeLength = (dictID>0) + (dictID>=256) + (dictID>=65536);   /* 0-3 */
    U32   const dictIDSizeCode = params.fParams.noDictIDFlag ? 0 : dictIDSizeCodeLength;   /* 0-3 */
    U32   const checksumFlag = params.fParams.checksumFlag>0;
    U32   const windowSize = (U32)1 << params.cParams.windowLog;
    U32   const singleSegment = params.fParams.contentSizeFlag && (windowSize >= pledgedSrcSize);
    BYTE  const windowLogByte = (BYTE)((params.cParams.windowLog - ZSTD_WINDOWLOG_ABSOLUTEMIN) << 3);
    U32   const fcsCode = params.fParams.contentSizeFlag ?
                     (pledgedSrcSize>=256) + (pledgedSrcSize>=65536+256) + (pledgedSrcSize>=0xFFFFFFFFU) : 0;  /* 0-3 */
    BYTE  const frameHeaderDecriptionByte = (BYTE)(dictIDSizeCode + (checksumFlag<<2) + (singleSegment<<5) + (fcsCode<<6) );
    size_t pos=0;

    assert(!(params.fParams.contentSizeFlag && pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN));
    if (dstCapacity < ZSTD_FRAMEHEADERSIZE_MAX) return ERROR(dstSize_tooSmall);
    DEBUGLOG(4, "ZSTD_writeFrameHeader : dictIDFlag : %u ; dictID : %u ; dictIDSizeCode : %u",
                !params.fParams.noDictIDFlag, (unsigned)dictID, (unsigned)dictIDSizeCode);

    if (params.format == ZSTD_f_zstd1) {
        MEM_writeLE32(dst, ZSTD_MAGICNUMBER);
        pos = 4;
    }
    op[pos++] = frameHeaderDecriptionByte;
    if (!singleSegment) op[pos++] = windowLogByte;
    switch(dictIDSizeCode)
    {
        default:  assert(0); /* impossible */
        case 0 : break;
        case 1 : op[pos] = (BYTE)(dictID); pos++; break;
        case 2 : MEM_writeLE16(op+pos, (U16)dictID); pos+=2; break;
        case 3 : MEM_writeLE32(op+pos, dictID); pos+=4; break;
    }
    switch(fcsCode)
    {
        default:  assert(0); /* impossible */
        case 0 : if (singleSegment) op[pos++] = (BYTE)(pledgedSrcSize); break;
        case 1 : MEM_writeLE16(op+pos, (U16)(pledgedSrcSize-256)); pos+=2; break;
        case 2 : MEM_writeLE32(op+pos, (U32)(pledgedSrcSize)); pos+=4; break;
        case 3 : MEM_writeLE64(op+pos, (U64)(pledgedSrcSize)); pos+=8; break;
    }
    return pos;
}